

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geometry.cpp
# Opt level: O3

Sphere __thiscall rw::MorphTarget::calculateBoundingSphere(MorphTarget *this)

{
  float fVar1;
  ulong uVar2;
  undefined1 auVar3 [16];
  int iVar4;
  V3d *pVVar5;
  undefined4 uVar6;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined1 auVar8 [16];
  undefined4 uVar11;
  float fVar14;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  Sphere SVar19;
  undefined8 uVar7;
  
  iVar4 = this->parent->numVertices;
  if (iVar4 < 1) {
    uVar7 = 0x4974240049742400;
    fVar16 = 1e+06;
    fVar18 = -1e+06;
    fVar14 = -1e+06;
    fVar15 = -1e+06;
  }
  else {
    pVVar5 = this->vertices;
    uVar6 = 0x49742400;
    uVar9 = 0x49742400;
    uVar10 = 0;
    uVar11 = 0;
    fVar18 = -1e+06;
    fVar14 = -1e+06;
    fVar16 = 1e+06;
    fVar17 = -1e+06;
    do {
      uVar2._0_4_ = pVVar5->x;
      uVar2._4_4_ = pVVar5->y;
      auVar8._8_8_ = 0;
      auVar8._0_8_ = uVar2;
      fVar15 = (float)(undefined4)uVar2;
      if ((float)(undefined4)uVar2 <= fVar18) {
        fVar15 = fVar18;
      }
      fVar18 = fVar15;
      auVar12._8_8_ = 0;
      auVar12._0_8_ = uVar2;
      auVar3._4_4_ = fVar14;
      auVar3._0_4_ = fVar18;
      auVar3._8_8_ = 0;
      auVar13 = maxps(auVar12,auVar3);
      fVar14 = auVar13._4_4_;
      auVar13._4_4_ = uVar9;
      auVar13._0_4_ = uVar6;
      auVar13._8_4_ = uVar10;
      auVar13._12_4_ = uVar11;
      auVar8 = minps(auVar8,auVar13);
      uVar7 = auVar8._0_8_;
      fVar1 = (float)pVVar5->z;
      fVar15 = fVar1;
      if (fVar1 <= fVar17) {
        fVar15 = fVar17;
      }
      if (fVar16 <= fVar1) {
        fVar1 = fVar16;
      }
      fVar16 = fVar1;
      pVVar5 = pVVar5 + 1;
      uVar6 = auVar8._0_4_;
      uVar9 = auVar8._4_4_;
      uVar10 = auVar8._8_4_;
      uVar11 = auVar8._12_4_;
      iVar4 = iVar4 + -1;
      fVar17 = fVar15;
    } while (iVar4 != 0);
  }
  SVar19.center.x = ((float)uVar7 + fVar18) * 0.5;
  SVar19.center.y = ((float)((ulong)uVar7 >> 0x20) + fVar14) * 0.5;
  SVar19.center.z = (fVar16 + fVar15) * 0.5;
  SVar19.radius =
       (float32)SQRT((fVar15 - SVar19.center.z) * (fVar15 - SVar19.center.z) +
                     (fVar18 - SVar19.center.x) * (fVar18 - SVar19.center.x) +
                     (fVar14 - SVar19.center.y) * (fVar14 - SVar19.center.y));
  return SVar19;
}

Assistant:

Sphere
MorphTarget::calculateBoundingSphere(void) const
{
	Sphere sphere;
	V3d min = {  1000000.0f,  1000000.0f,  1000000.0f };
	V3d max = { -1000000.0f, -1000000.0f, -1000000.0f };
	V3d *v = this->vertices;
	for(int32 j = 0; j < this->parent->numVertices; j++){
		if(v->x > max.x) max.x = v->x;
		if(v->x < min.x) min.x = v->x;
		if(v->y > max.y) max.y = v->y;
		if(v->y < min.y) min.y = v->y;
		if(v->z > max.z) max.z = v->z;
		if(v->z < min.z) min.z = v->z;
		v++;
	}
	sphere.center = scale(add(min, max), 1/2.0f);
	max = sub(max, sphere.center);
	sphere.radius = length(max);
	return sphere;
}